

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

ConversionSchema * __thiscall
Assimp::STEP::EXPRESS::ConversionSchema::operator=
          (ConversionSchema *this,SchemaEntry (*schemas) [980])

{
  char *__s;
  mapped_type p_Var1;
  mapped_type *pp_Var2;
  allocator<char> local_49;
  key_type local_48;
  undefined8 *local_28;
  SchemaEntry *schema;
  size_t i;
  SchemaEntry (*schemas_local) [980];
  ConversionSchema *this_local;
  
  i = (size_t)schemas;
  schemas_local = (SchemaEntry (*) [980])this;
  for (schema = (SchemaEntry *)0x0; schema < (SchemaEntry *)0x3d4;
      schema = (SchemaEntry *)((long)&schema->mName + 1)) {
    local_28 = (undefined8 *)(i + (long)schema * 0x10);
    __s = (char *)*local_28;
    p_Var1 = (mapped_type)local_28[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    pp_Var2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
              ::operator[](&this->converters,&local_48);
    *pp_Var2 = p_Var1;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return this;
}

Assistant:

const ConversionSchema& operator=( const SchemaEntry (& schemas)[N]) {
                for(size_t i = 0; i < N; ++i ) {
                    const SchemaEntry& schema = schemas[i];
                    converters[schema.mName] = schema.mFunc;
                }
                return *this;
            }